

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O0

void __thiscall efsw::FileWatcherGeneric::watch(FileWatcherGeneric *this)

{
  Thread *this_00;
  FileWatcherGeneric *this_local;
  
  if (this->mThread == (Thread *)0x0) {
    this_00 = (Thread *)operator_new(0x18);
    Thread::Thread<efsw::FileWatcherGeneric>
              (this_00,(offset_in_FileWatcherGeneric_to_subr)run,(FileWatcherGeneric *)0x0);
    this->mThread = this_00;
    (*this->mThread->_vptr_Thread[2])();
  }
  return;
}

Assistant:

void FileWatcherGeneric::watch() {
	if ( NULL == mThread ) {
		mThread = new Thread( &FileWatcherGeneric::run, this );
		mThread->launch();
	}
}